

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderFrameBorder(ImVec2 p_min,ImVec2 p_max,float rounding)

{
  float thickness;
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImU32 IVar7;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec4 local_48;
  ImVec2 local_38;
  ImVec2 local_30;
  
  thickness = (GImGui->Style).FrameBorderSize;
  if (0.0 < thickness) {
    pIVar1 = GImGui->CurrentWindow;
    pIVar2 = pIVar1->DrawList;
    local_30.y = p_min.y + 1.0;
    local_30.x = p_min.x + 1.0;
    local_38.y = p_max.y + 1.0;
    local_38.x = p_max.x + 1.0;
    local_48.x = (GImGui->Style).Colors[6].x;
    local_48.y = (GImGui->Style).Colors[6].y;
    uVar3 = (GImGui->Style).Colors[6].z;
    uVar4 = (GImGui->Style).Colors[6].w;
    local_48.w = (GImGui->Style).Alpha * (float)uVar4;
    local_48.z = (float)uVar3;
    local_58 = p_max;
    local_50 = p_min;
    IVar7 = ColorConvertFloat4ToU32(&local_48);
    ImDrawList::AddRect(pIVar2,&local_30,&local_38,IVar7,rounding,0xf,thickness);
    pIVar2 = pIVar1->DrawList;
    local_48.x = (GImGui->Style).Colors[5].x;
    local_48.y = (GImGui->Style).Colors[5].y;
    uVar5 = (GImGui->Style).Colors[5].z;
    uVar6 = (GImGui->Style).Colors[5].w;
    local_48.w = (GImGui->Style).Alpha * (float)uVar6;
    local_48.z = (float)uVar5;
    IVar7 = ColorConvertFloat4ToU32(&local_48);
    ImDrawList::AddRect(pIVar2,&local_50,&local_58,IVar7,rounding,0xf,thickness);
  }
  return;
}

Assistant:

void ImGui::RenderFrameBorder(ImVec2 p_min, ImVec2 p_max, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const float border_size = g.Style.FrameBorderSize;
    if (border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min+ImVec2(1,1), p_max+ImVec2(1,1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}